

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddImageRounded
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *a,ImVec2 *b,ImVec2 *uv_a,
          ImVec2 *uv_b,ImU32 col,float rounding,int rounding_corners)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ImVec2 *__src;
  ImDrawVert *pIVar4;
  ImVec2 *__dest;
  uint uVar5;
  bool bVar6;
  
  if (0xffffff < col) {
    if (0.0 < rounding && (rounding_corners & 0xfU) != 0) {
      uVar1 = (this->_TextureIdStack).Size;
      if ((ulong)uVar1 == 0) {
        bVar6 = true;
      }
      else {
        if ((int)uVar1 < 1) {
          __assert_fail("Size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                        ,0x4ca,"value_type &ImVector<void *>::back() [T = void *]");
        }
        bVar6 = (this->_TextureIdStack).Data[(ulong)uVar1 - 1] != user_texture_id;
      }
      if (bVar6) {
        PushTextureID(this,user_texture_id);
      }
      iVar2 = (this->VtxBuffer).Size;
      PathRect(this,a,b,rounding,rounding_corners);
      AddConvexPolyFilled(this,(this->_Path).Data,(this->_Path).Size,col);
      iVar3 = (this->_Path).Capacity;
      if (iVar3 < 0) {
        uVar5 = iVar3 / 2 + iVar3;
        uVar1 = 0;
        if (0 < (int)uVar5) {
          uVar1 = uVar5;
        }
        __dest = (ImVec2 *)ImGui::MemAlloc((ulong)uVar1 * 8);
        __src = (this->_Path).Data;
        if (__src != (ImVec2 *)0x0) {
          memcpy(__dest,__src,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = __dest;
        (this->_Path).Capacity = uVar1;
      }
      (this->_Path).Size = 0;
      pIVar4 = (this->VtxBuffer).Data;
      ImGui::ShadeVertsLinearUV(pIVar4 + iVar2,pIVar4 + (this->VtxBuffer).Size,a,b,uv_a,uv_b,true);
      if (bVar6) {
        PopTextureID(this);
        return;
      }
    }
    else {
      AddImage(this,user_texture_id,a,b,uv_a,uv_b,col);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddImageRounded(ImTextureID user_texture_id, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, ImU32 col, float rounding, int rounding_corners)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    if (rounding <= 0.0f || (rounding_corners & ImDrawCornerFlags_All) == 0)
    {
        AddImage(user_texture_id, a, b, uv_a, uv_b, col);
        return;
    }

    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    int vert_start_idx = VtxBuffer.Size;
    PathRect(a, b, rounding, rounding_corners);
    PathFillConvex(col);
    int vert_end_idx = VtxBuffer.Size;
    ImGui::ShadeVertsLinearUV(VtxBuffer.Data + vert_start_idx, VtxBuffer.Data + vert_end_idx, a, b, uv_a, uv_b, true);

    if (push_texture_id)
        PopTextureID();
}